

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O0

uint64 ctemplate::MurmurHash64(char *ptr,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint64 h;
  uint32 k1_1;
  uint32 k2;
  uint32 k1;
  uint32 h2;
  uint32 h1;
  uint32 kHashSeed2;
  uint32 kHashSeed1;
  int kShiftVal;
  uint32 kMultiplyVal;
  size_t len_local;
  char *ptr_local;
  
  k1 = (uint)len ^ 0xc86b14f7;
  k2 = 0x650f5c4d;
  len_local = (size_t)ptr;
  for (_kShiftVal = len; 7 < _kShiftVal; _kShiftVal = _kShiftVal - 8) {
    k1 = ((uint)(*(int *)len_local * 0x5bd1e995) >> 0x18 ^ *(int *)len_local * 0x5bd1e995) *
         0x5bd1e995 ^ k1 * 0x5bd1e995;
    uVar1 = *(int *)(len_local + 4) * 0x5bd1e995;
    k2 = (uVar1 >> 0x18 ^ uVar1) * 0x5bd1e995 ^ k2 * 0x5bd1e995;
    len_local = len_local + 8;
  }
  if (3 < _kShiftVal) {
    k1 = ((uint)(*(int *)len_local * 0x5bd1e995) >> 0x18 ^ *(int *)len_local * 0x5bd1e995) *
         0x5bd1e995 ^ k1 * 0x18;
    len_local = len_local + 4;
    _kShiftVal = _kShiftVal - 4;
  }
  if (_kShiftVal != 1) {
    if (_kShiftVal != 2) {
      if (_kShiftVal != 3) goto LAB_0017f36b;
      k2 = (int)*(char *)(len_local + 2) << 0x10 ^ k2;
    }
    k2 = (int)*(char *)(len_local + 1) << 8 ^ k2;
  }
  k2 = (int)*(char *)len_local ^ k2;
LAB_0017f36b:
  uVar1 = (k2 * 0x5bd1e995 >> 0x12 ^ k1) * 0x5bd1e995;
  uVar2 = (uVar1 >> 0x16 ^ k2 * 0x5bd1e995) * 0x5bd1e995;
  return CONCAT44((uVar2 >> 0x11 ^ uVar1) * 0x5bd1e995,uVar2);
}

Assistant:

uint64 MurmurHash64(const char* ptr, size_t len) {
  const uint32 kMultiplyVal = 0x5bd1e995;
  const int kShiftVal = 24;
  const uint32 kHashSeed1 = 0xc86b14f7;
  const uint32 kHashSeed2 = 0x650f5c4d;

  uint32 h1 = kHashSeed1 ^ len, h2 = kHashSeed2;
  while (len >= 8) {
    uint32 k1 = UNALIGNED_LOAD32(ptr);
    k1 *= kMultiplyVal;
    k1 ^= k1 >> kShiftVal;
    k1 *= kMultiplyVal;

    h1 *= kMultiplyVal;
    h1 ^= k1;
    ptr += 4;

    uint32 k2 = UNALIGNED_LOAD32(ptr);
    k2 *= kMultiplyVal;
    k2 ^= k2 >> kShiftVal;
    k2 *= kMultiplyVal;

    h2 *= kMultiplyVal;
    h2 ^= k2;
    ptr += 4;

    len -= 8;
  }

  if (len >= 4) {
    uint32 k1 = UNALIGNED_LOAD32(ptr);
    k1 *= kMultiplyVal;
    k1 ^= k1 >> kShiftVal;
    k1 *= kMultiplyVal;

    h1 *= kShiftVal;
    h1 ^= k1;

    ptr += 4;
    len -= 4;
  }

  switch(len) {
    case 3:
      h2 ^= ptr[2] << 16;  // fall through.
    case 2:
      h2 ^= ptr[1] << 8;  // fall through.
    case 1:
      h2 ^= ptr[0];  // fall through.
    default:
      h2 *= kMultiplyVal;
  }

  h1 ^= h2 >> 18;
  h1 *= kMultiplyVal;
  h2 ^= h1 >> 22;
  h2 *= kMultiplyVal;
  h1 ^= h2 >> 17;
  h1 *= kMultiplyVal;

  uint64 h = h1;
  h = (h << 32) | h2;
  return h;
}